

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-matchers.h
# Opt level: O3

void __thiscall
testing::Matcher<const_std::basic_string_view<char,_std::char_traits<char>_>_&>::~Matcher
          (Matcher<const_std::basic_string_view<char,_std::char_traits<char>_>_&> *this)

{
  VTable *pVVar1;
  SharedPayloadBase *pSVar2;
  
  (this->super_MatcherBase<const_std::basic_string_view<char,_std::char_traits<char>_>_&>).
  super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_00171b70;
  pVVar1 = (this->super_MatcherBase<const_std::basic_string_view<char,_std::char_traits<char>_>_&>).
           vtable_;
  if ((pVVar1 != (VTable *)0x0) &&
     (pVVar1->shared_destroy != (_func_void_SharedPayloadBase_ptr *)0x0)) {
    pSVar2 = (this->super_MatcherBase<const_std::basic_string_view<char,_std::char_traits<char>_>_&>
             ).buffer_.shared;
    LOCK();
    (pSVar2->ref).super___atomic_base<int>._M_i = (pSVar2->ref).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pSVar2->ref).super___atomic_base<int>._M_i == 0) {
      (*((this->super_MatcherBase<const_std::basic_string_view<char,_std::char_traits<char>_>_&>).
        vtable_)->shared_destroy)
                ((SharedPayloadBase *)
                 (this->
                 super_MatcherBase<const_std::basic_string_view<char,_std::char_traits<char>_>_&>).
                 buffer_.ptr);
    }
  }
  operator_delete(this,0x18);
  return;
}

Assistant:

class GTEST_API_ Matcher<const internal::StringView&>
    : public internal::MatcherBase<const internal::StringView&> {
 public:
  Matcher() {}

  explicit Matcher(const MatcherInterface<const internal::StringView&>* impl)
      : internal::MatcherBase<const internal::StringView&>(impl) {}

  template <typename M, typename = typename std::remove_reference<
                            M>::type::is_gtest_matcher>
  Matcher(M&& m)  // NOLINT
      : internal::MatcherBase<const internal::StringView&>(std::forward<M>(m)) {
  }

  // Allows the user to write str instead of Eq(str) sometimes, where
  // str is a std::string object.
  Matcher(const std::string& s);  // NOLINT

  // Allows the user to write "foo" instead of Eq("foo") sometimes.
  Matcher(const char* s);  // NOLINT

  // Allows the user to pass absl::string_views or std::string_views directly.
  Matcher(internal::StringView s);  // NOLINT
}